

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

bool __thiscall AnyType::OutputFromType<VisibleString>(AnyType *this,ostream *os)

{
  size_type *psVar1;
  bool bVar2;
  undefined1 local_50 [8];
  VisibleString t;
  
  psVar1 = &t.value._M_string_length;
  t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
  local_50 = (undefined1  [8])&PTR_EncodedSize_00151cb0;
  t.value._M_dataplus._M_p = (pointer)0x0;
  t.value._M_string_length._0_1_ = 0;
  t.super_DerBase.cbData = (size_t)psVar1;
  bVar2 = ConvertToType<VisibleString>(this,(VisibleString *)local_50);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(char *)t.super_DerBase.cbData,(long)t.value._M_dataplus._M_p);
  }
  if ((size_type *)t.super_DerBase.cbData != psVar1) {
    operator_delete((void *)t.super_DerBase.cbData);
  }
  return bVar2;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }